

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_Menu.cxx
# Opt level: O0

void __thiscall menuwindow::draw(menuwindow *this)

{
  uchar uVar1;
  byte bVar2;
  Fl_Boxtype t;
  int w;
  int h;
  Fl_Menu_Item *pFVar3;
  Fl_Color local_38;
  int local_1c;
  Fl_Menu_Item *pFStack_18;
  int j;
  Fl_Menu_Item *m;
  menuwindow *this_local;
  
  uVar1 = Fl_Widget::damage((Fl_Widget *)this);
  if (uVar1 == '\x01') {
    bVar2 = Fl_Widget::damage((Fl_Widget *)this);
    if (((bVar2 & 1) != 0) && (this->selected != this->drawn_selected)) {
      pFVar3 = Fl_Menu_Item::next(this->menu,this->drawn_selected);
      drawentry(this,pFVar3,this->drawn_selected,1);
      pFVar3 = Fl_Menu_Item::next(this->menu,this->selected);
      drawentry(this,pFVar3,this->selected,1);
    }
  }
  else {
    t = Fl_Widget::box((Fl_Widget *)this);
    w = Fl_Widget::w((Fl_Widget *)this);
    h = Fl_Widget::h((Fl_Widget *)this);
    if (button == (Fl_Menu_ *)0x0) {
      local_38 = Fl_Widget::color((Fl_Widget *)this);
    }
    else {
      local_38 = Fl_Widget::color(&button->super_Fl_Widget);
    }
    fl_draw_box(t,0,0,w,h,local_38);
    if (this->menu != (Fl_Menu_Item *)0x0) {
      pFStack_18 = Fl_Menu_Item::first(this->menu);
      local_1c = 0;
      for (; pFStack_18->text != (char *)0x0; pFStack_18 = Fl_Menu_Item::next(pFStack_18,1)) {
        drawentry(this,pFStack_18,local_1c,0);
        local_1c = local_1c + 1;
      }
    }
  }
  this->drawn_selected = this->selected;
  return;
}

Assistant:

void menuwindow::draw() {
  if (damage() != FL_DAMAGE_CHILD) {	// complete redraw
    fl_draw_box(box(), 0, 0, w(), h(), button ? button->color() : color());
    if (menu) {
      const Fl_Menu_Item* m; int j;
      for (m=menu->first(), j=0; m->text; j++, m = m->next()) drawentry(m, j, 0);
    }
  } else {
    if (damage() & FL_DAMAGE_CHILD && selected!=drawn_selected) { // change selection
      drawentry(menu->next(drawn_selected), drawn_selected, 1);
      drawentry(menu->next(selected), selected, 1);
    }
  }	    
  drawn_selected = selected;
}